

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qjsonwriter.cpp
# Opt level: O2

void valueContentToJson(QCborValue *v,QByteArray *json,int indent,bool compact)

{
  Type TVar1;
  char ch;
  char *pcVar2;
  long in_FS_OFFSET;
  QStringView s;
  undefined1 local_78 [16];
  qsizetype local_68;
  QArrayDataPointer<char16_t> local_58;
  QArrayDataPointer<char> local_40;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  TVar1 = v->t;
  if (TVar1 == Integer) {
    QByteArray::number((QByteArray *)&local_40,v->n,10);
    QByteArray::append(json,(QByteArray *)&local_40);
LAB_002ca8fa:
    QArrayDataPointer<char>::~QArrayDataPointer(&local_40);
  }
  else {
    if (TVar1 == String) {
      QByteArray::append(json,'\"');
      local_78 = (undefined1  [16])0x0;
      local_68 = 0;
      QCborValue::toString((QString *)&local_58,(QCborValue *)v,(QString *)local_78);
      s.m_data = local_58.ptr;
      s.m_size = local_58.size;
      escapedString((QByteArray *)&local_40,s);
      QByteArray::append(json,(QByteArray *)&local_40);
      QArrayDataPointer<char>::~QArrayDataPointer(&local_40);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_78);
      ch = '\"';
    }
    else if (TVar1 == Array) {
      pcVar2 = "[\n";
      if (compact) {
        pcVar2 = "[";
      }
      QByteArray::append(json,pcVar2);
      arrayContentToJson(v->container,json,(uint)!compact + indent,compact);
      QByteArray::QByteArray((QByteArray *)&local_40,(long)(indent << 2),' ');
      QByteArray::append(json,(QByteArray *)&local_40);
      QArrayDataPointer<char>::~QArrayDataPointer(&local_40);
      ch = ']';
    }
    else {
      if (TVar1 != Map) {
        if (TVar1 == False) {
          if (*(long *)(in_FS_OFFSET + 0x28) != local_28) goto LAB_002ca991;
          pcVar2 = "false";
          goto LAB_002ca7cf;
        }
        if (TVar1 == Double) {
          if ((ulong)ABS((double)v->n) < 0x7ff0000000000000) {
            QByteArray::number((QByteArray *)&local_40,(double)v->n,'g',-0x80);
            QByteArray::append(json,(QByteArray *)&local_40);
            goto LAB_002ca8fa;
          }
        }
        else if (TVar1 == True) {
          if (*(long *)(in_FS_OFFSET + 0x28) != local_28) goto LAB_002ca991;
          pcVar2 = "true";
          goto LAB_002ca7cf;
        }
        if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
          pcVar2 = "null";
LAB_002ca7cf:
          QByteArray::append(json,pcVar2);
          return;
        }
        goto LAB_002ca991;
      }
      pcVar2 = "{\n";
      if (compact) {
        pcVar2 = "{";
      }
      QByteArray::append(json,pcVar2);
      objectContentToJson(v->container,json,(uint)!compact + indent,compact);
      QByteArray::QByteArray((QByteArray *)&local_40,(long)(indent << 2),' ');
      QByteArray::append(json,(QByteArray *)&local_40);
      QArrayDataPointer<char>::~QArrayDataPointer(&local_40);
      ch = '}';
    }
    QByteArray::append(json,ch);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
LAB_002ca991:
  __stack_chk_fail();
}

Assistant:

static void valueContentToJson(const QCborValue &v, QByteArray &json, int indent, bool compact)
{
    QCborValue::Type type = v.type();
    switch (type) {
    case QCborValue::True:
        json += "true";
        break;
    case QCborValue::False:
        json += "false";
        break;
    case QCborValue::Integer:
        json += QByteArray::number(v.toInteger());
        break;
    case QCborValue::Double: {
        const double d = v.toDouble();
        if (qt_is_finite(d))
            json += QByteArray::number(d, 'g', QLocale::FloatingPointShortest);
        else
            json += "null"; // +INF || -INF || NaN (see RFC4627#section2.4)
        break;
    }
    case QCborValue::String:
        json += '"';
        json += escapedString(v.toString());
        json += '"';
        break;
    case QCborValue::Array:
        json += compact ? "[" : "[\n";
        arrayContentToJson(
                QJsonPrivate::Value::container(v), json, indent + (compact ? 0 : 1), compact);
        json += QByteArray(4*indent, ' ');
        json += ']';
        break;
    case QCborValue::Map:
        json += compact ? "{" : "{\n";
        objectContentToJson(
                QJsonPrivate::Value::container(v), json, indent + (compact ? 0 : 1), compact);
        json += QByteArray(4*indent, ' ');
        json += '}';
        break;
    case QCborValue::Null:
    default:
        json += "null";
    }
}